

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSparseSDF.h
# Opt level: O2

void __thiscall btSparseSdf<3>::Reset(btSparseSdf<3> *this)

{
  uint uVar1;
  Cell **ppCVar2;
  Cell *pCVar3;
  Cell *pCVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = (this->cells).m_size;
  uVar6 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    ppCVar2 = (this->cells).m_data;
    pCVar4 = ppCVar2[uVar6];
    ppCVar2[uVar6] = (Cell *)0x0;
    while (pCVar4 != (Cell *)0x0) {
      pCVar3 = pCVar4->next;
      ::operator_delete(pCVar4);
      pCVar4 = pCVar3;
    }
  }
  this->voxelsz = 0.25;
  this->puid = 0;
  this->ncells = 0;
  this->nprobes = 1;
  this->nqueries = 1;
  return;
}

Assistant:

void					Reset()
	{
		for(int i=0,ni=cells.size();i<ni;++i)
		{
			Cell*	pc=cells[i];
			cells[i]=0;
			while(pc)
			{
				Cell*	pn=pc->next;
				delete pc;
				pc=pn;
			}
		}
		voxelsz		=0.25;
		puid		=0;
		ncells		=0;
		nprobes		=1;
		nqueries	=1;
	}